

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O1

int mbedtls_ssl_ciphersuite_uses_ec(mbedtls_ssl_ciphersuite_t *info)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = info->key_exchange - MBEDTLS_KEY_EXCHANGE_ECDHE_RSA;
  iVar1 = 0;
  if (uVar2 < 8) {
    iVar1 = *(int *)(&DAT_00155c08 + (ulong)uVar2 * 4);
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_ciphersuite_uses_ec( const mbedtls_ssl_ciphersuite_t *info )
{
    switch( info->key_exchange )
    {
        case MBEDTLS_KEY_EXCHANGE_ECDHE_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
        case MBEDTLS_KEY_EXCHANGE_ECDH_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA:
            return( 1 );

        default:
            return( 0 );
    }
}